

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_create_resolving_functions(JSContext *ctx,JSValue *resolving_funcs,JSValue promise)

{
  JSPromiseFunctionDataResolved *sr;
  JSValueUnion *pJVar1;
  JSValueUnion JVar2;
  long lVar3;
  JSClassID class_id;
  int iVar4;
  JSValue v;
  uint local_38;
  
  JVar2 = promise.u;
  sr = (JSPromiseFunctionDataResolved *)js_malloc(ctx,8);
  if (sr == (JSPromiseFunctionDataResolved *)0x0) {
    iVar4 = -1;
  }
  else {
    sr->ref_count = 1;
    sr->already_resolved = 0;
    class_id = 0x2b;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 0x10) {
      v = JS_NewObjectProtoClass(ctx,ctx->function_proto,class_id);
      if ((v.tag & 0xffffffffU) == 6) {
LAB_0013c89e:
        iVar4 = -1;
        if (lVar3 != 0) {
          JS_FreeValue(ctx,*resolving_funcs);
        }
        goto LAB_0013c8c0;
      }
      pJVar1 = (JSValueUnion *)js_malloc(ctx,0x18);
      if (pJVar1 == (JSValueUnion *)0x0) {
        JS_FreeValue(ctx,v);
        goto LAB_0013c89e;
      }
      sr->ref_count = sr->ref_count + 1;
      pJVar1[2].ptr = sr;
      local_38 = (uint)promise.tag;
      if (0xfffffff4 < local_38) {
        *(int *)JVar2.ptr = *JVar2.ptr + 1;
      }
      pJVar1->ptr = (void *)JVar2;
      pJVar1[1] = (JSValueUnion)promise.tag;
      if ((int)v.tag == -1) {
        *(JSValueUnion **)((long)v.u.ptr + 0x30) = pJVar1;
      }
      js_function_set_properties(ctx,v,0x2f,1);
      ((JSValueUnion *)((long)&resolving_funcs->u + lVar3))->ptr = (void *)v.u;
      *(int64_t *)((long)&resolving_funcs->tag + lVar3) = v.tag;
      class_id = class_id + 1;
    }
    iVar4 = 0;
LAB_0013c8c0:
    js_promise_resolve_function_free_resolved(ctx->rt,sr);
  }
  return iVar4;
}

Assistant:

static int js_create_resolving_functions(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst promise)

{
    JSValue obj;
    JSPromiseFunctionData *s;
    JSPromiseFunctionDataResolved *sr;
    int i, ret;

    sr = js_malloc(ctx, sizeof(*sr));
    if (!sr)
        return -1;
    sr->ref_count = 1;
    sr->already_resolved = FALSE; /* must be shared between the two functions */
    ret = 0;
    for(i = 0; i < 2; i++) {
        obj = JS_NewObjectProtoClass(ctx, ctx->function_proto,
                                     JS_CLASS_PROMISE_RESOLVE_FUNCTION + i);
        if (JS_IsException(obj))
            goto fail;
        s = js_malloc(ctx, sizeof(*s));
        if (!s) {
            JS_FreeValue(ctx, obj);
        fail:

            if (i != 0)
                JS_FreeValue(ctx, resolving_funcs[0]);
            ret = -1;
            break;
        }
        sr->ref_count++;
        s->presolved = sr;
        s->promise = JS_DupValue(ctx, promise);
        JS_SetOpaque(obj, s);
        js_function_set_properties(ctx, obj, JS_ATOM_empty_string, 1);
        resolving_funcs[i] = obj;
    }
    js_promise_resolve_function_free_resolved(ctx->rt, sr);
    return ret;
}